

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O2

CURLMcode curl_multi_wait(CURLM *multi_handle,curl_waitfd *extra_fds,uint extra_nfds,int timeout_ms,
                         int *ret)

{
  CURLMcode CVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  pollfd *ufds;
  long lVar5;
  ulong uVar6;
  ulong extraout_RDX;
  ulong extraout_RDX_00;
  ulong uVar7;
  ulong extraout_RDX_01;
  ulong extraout_RDX_02;
  int iVar8;
  uint uVar9;
  ushort uVar10;
  Curl_multi *multi;
  SessionHandle *data;
  SessionHandle *data_00;
  int iVar11;
  curl_socket_t sockbunch [5];
  long timeout_internal;
  
  uVar6 = (ulong)extra_nfds;
  CVar1 = CURLM_BAD_HANDLE;
  if ((multi_handle != (CURLM *)0x0) && (*multi_handle == 0xbab1e)) {
    multi_timeout((Curl_multi *)multi_handle,&timeout_internal);
    data = (SessionHandle *)((long)multi_handle + 8);
    iVar11 = 0;
    uVar7 = extraout_RDX;
    data_00 = data;
LAB_0042620b:
    data_00 = data_00->next;
    if (data_00 != (SessionHandle *)0x0) {
      uVar2 = multi_getsock(data_00,sockbunch,(int)uVar7);
      lVar5 = 0;
      uVar7 = extraout_RDX_00;
      do {
        if (lVar5 == 5) break;
        if ((uVar2 >> ((uint)lVar5 & 0x1f) & 1) == 0) {
          uVar7 = 0xffffffff;
        }
        else {
          iVar11 = iVar11 + 1;
          uVar7 = (ulong)(uint)sockbunch[lVar5];
        }
        if (((uVar2 >> ((byte)lVar5 & 0x1f)) >> 0x10 & 1) != 0) {
          iVar11 = iVar11 + 1;
          uVar7 = (ulong)(uint)sockbunch[lVar5];
        }
        lVar5 = lVar5 + 1;
      } while ((int)uVar7 != -1);
      goto LAB_0042620b;
    }
    lVar5 = (long)timeout_ms;
    if (timeout_internal < timeout_ms) {
      lVar5 = timeout_internal;
    }
    uVar2 = (uint)lVar5;
    if (timeout_internal < 0) {
      uVar2 = timeout_ms;
    }
    uVar9 = 0;
    if (iVar11 + extra_nfds == 0 && extra_nfds == 0) {
      ufds = (pollfd *)0x0;
    }
    else {
      ufds = (pollfd *)(*Curl_cmalloc)((ulong)(iVar11 + extra_nfds) << 3);
      uVar6 = extraout_RDX_01;
      if (ufds == (pollfd *)0x0) {
        return CURLM_OUT_OF_MEMORY;
      }
    }
    if (iVar11 != 0) {
      uVar9 = 0;
LAB_004262a9:
      data = data->next;
      if (data != (SessionHandle *)0x0) {
        uVar3 = multi_getsock(data,sockbunch,(int)uVar6);
        lVar5 = 0;
        uVar6 = extraout_RDX_02;
        do {
          if (lVar5 == 5) break;
          if ((uVar3 >> ((uint)lVar5 & 0x1f) & 1) == 0) {
            uVar6 = 0xffffffff;
          }
          else {
            uVar6 = (ulong)(uint)sockbunch[lVar5];
            ufds[uVar9].fd = sockbunch[lVar5];
            ufds[uVar9].events = 1;
            uVar9 = uVar9 + 1;
          }
          if (((uVar3 >> ((byte)lVar5 & 0x1f)) >> 0x10 & 1) != 0) {
            uVar6 = (ulong)(uint)sockbunch[lVar5];
            ufds[uVar9].fd = sockbunch[lVar5];
            ufds[uVar9].events = 4;
            uVar9 = uVar9 + 1;
          }
          lVar5 = lVar5 + 1;
        } while ((int)uVar6 != -1);
        goto LAB_004262a9;
      }
    }
    for (uVar6 = 0; uVar7 = uVar9 + uVar6, extra_nfds != uVar6; uVar6 = uVar6 + 1) {
      uVar7 = uVar7 & 0xffffffff;
      ufds[uVar7].fd = extra_fds[uVar6].fd;
      uVar10 = extra_fds[uVar6].events & 1;
      ufds[uVar7].events = uVar10;
      if ((extra_fds[uVar6].events & 6U) != 0) {
        ufds[uVar7].events = uVar10 | extra_fds[uVar6].events & 6U;
      }
    }
    if ((uint)uVar7 == 0) {
      iVar8 = 0;
    }
    else {
      Curl_infof((SessionHandle *)0x0,"Curl_poll(%d ds, %d ms)\n",uVar7 & 0xffffffff,(ulong)uVar2);
      iVar4 = Curl_poll(ufds,(uint)uVar7,uVar2);
      iVar8 = 0;
      if (iVar4 != 0) {
        for (uVar6 = 0; iVar8 = iVar4, extra_nfds != uVar6; uVar6 = uVar6 + 1) {
          extra_fds[uVar6].revents = ufds[(uint)(iVar11 + (int)uVar6)].revents & 7;
        }
      }
    }
    if (ufds != (pollfd *)0x0) {
      (*Curl_cfree)(ufds);
    }
    CVar1 = CURLM_OK;
    if (ret != (int *)0x0) {
      *ret = iVar8;
    }
  }
  return CVar1;
}

Assistant:

CURLMcode curl_multi_wait(CURLM *multi_handle,
                          struct curl_waitfd extra_fds[],
                          unsigned int extra_nfds,
                          int timeout_ms,
                          int *ret)
{
  struct Curl_multi *multi=(struct Curl_multi *)multi_handle;
  struct SessionHandle *data;
  curl_socket_t sockbunch[MAX_SOCKSPEREASYHANDLE];
  int bitmap;
  unsigned int i;
  unsigned int nfds = 0;
  unsigned int curlfds;
  struct pollfd *ufds = NULL;
  long timeout_internal;

  if(!GOOD_MULTI_HANDLE(multi))
    return CURLM_BAD_HANDLE;

  /* If the internally desired timeout is actually shorter than requested from
     the outside, then use the shorter time! But only if the internal timer
     is actually larger than -1! */
  (void)multi_timeout(multi, &timeout_internal);
  if((timeout_internal >= 0) && (timeout_internal < (long)timeout_ms))
    timeout_ms = (int)timeout_internal;

  /* Count up how many fds we have from the multi handle */
  data=multi->easyp;
  while(data) {
    bitmap = multi_getsock(data, sockbunch, MAX_SOCKSPEREASYHANDLE);

    for(i=0; i< MAX_SOCKSPEREASYHANDLE; i++) {
      curl_socket_t s = CURL_SOCKET_BAD;

      if(bitmap & GETSOCK_READSOCK(i)) {
        ++nfds;
        s = sockbunch[i];
      }
      if(bitmap & GETSOCK_WRITESOCK(i)) {
        ++nfds;
        s = sockbunch[i];
      }
      if(s == CURL_SOCKET_BAD) {
        break;
      }
    }

    data = data->next; /* check next handle */
  }

  curlfds = nfds; /* number of internal file descriptors */
  nfds += extra_nfds; /* add the externally provided ones */

  if(nfds || extra_nfds) {
    ufds = malloc(nfds * sizeof(struct pollfd));
    if(!ufds)
      return CURLM_OUT_OF_MEMORY;
  }
  nfds = 0;

  /* only do the second loop if we found descriptors in the first stage run
     above */

  if(curlfds) {
    /* Add the curl handles to our pollfds first */
    data=multi->easyp;
    while(data) {
      bitmap = multi_getsock(data, sockbunch, MAX_SOCKSPEREASYHANDLE);

      for(i=0; i< MAX_SOCKSPEREASYHANDLE; i++) {
        curl_socket_t s = CURL_SOCKET_BAD;

        if(bitmap & GETSOCK_READSOCK(i)) {
          ufds[nfds].fd = sockbunch[i];
          ufds[nfds].events = POLLIN;
          ++nfds;
          s = sockbunch[i];
        }
        if(bitmap & GETSOCK_WRITESOCK(i)) {
          ufds[nfds].fd = sockbunch[i];
          ufds[nfds].events = POLLOUT;
          ++nfds;
          s = sockbunch[i];
        }
        if(s == CURL_SOCKET_BAD) {
          break;
        }
      }

      data = data->next; /* check next handle */
    }
  }

  /* Add external file descriptions from poll-like struct curl_waitfd */
  for(i = 0; i < extra_nfds; i++) {
    ufds[nfds].fd = extra_fds[i].fd;
    ufds[nfds].events = 0;
    if(extra_fds[i].events & CURL_WAIT_POLLIN)
      ufds[nfds].events |= POLLIN;
    if(extra_fds[i].events & CURL_WAIT_POLLPRI)
      ufds[nfds].events |= POLLPRI;
    if(extra_fds[i].events & CURL_WAIT_POLLOUT)
      ufds[nfds].events |= POLLOUT;
    ++nfds;
  }

  if(nfds) {
    /* wait... */
    infof(data, "Curl_poll(%d ds, %d ms)\n", nfds, timeout_ms);
    i = Curl_poll(ufds, nfds, timeout_ms);

    if(i) {
      unsigned int j;
      /* copy revents results from the poll to the curl_multi_wait poll
         struct, the bit values of the actual underlying poll() implementation
         may not be the same as the ones in the public libcurl API! */
      for(j = 0; j < extra_nfds; j++) {
        unsigned short mask = 0;
        unsigned r = ufds[curlfds + j].revents;

        if(r & POLLIN)
          mask |= CURL_WAIT_POLLIN;
        if(r & POLLOUT)
          mask |= CURL_WAIT_POLLOUT;
        if(r & POLLPRI)
          mask |= CURL_WAIT_POLLPRI;

        extra_fds[j].revents = mask;
      }
    }
  }
  else
    i = 0;

  Curl_safefree(ufds);
  if(ret)
    *ret = i;
  return CURLM_OK;
}